

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::traverseAnnotationDecl
          (TraverseSchema *this,DOMElement *annotationElem,
          ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList,bool topLevel)

{
  XMLBuffer *this_00;
  GeneralAttributeCheck *this_01;
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  XMLCh *content;
  _func_int **pp_Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  DOMNode *node;
  undefined4 extraout_var;
  long *plVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode **ppDVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  XSAnnotation *this_02;
  short *psVar14;
  short *psVar15;
  XMLSize_t i;
  XMLSize_t getAt;
  TraverseSchema *this_03;
  NamespaceScopeManager nsMgr;
  XMLCh *local_60;
  NamespaceScopeManager local_40;
  short *psVar11;
  undefined4 extraout_var_00;
  
  pSVar3 = this->fSchemaInfo;
  if (annotationElem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,annotationElem);
  }
  this_01 = &this->fAttributeCheck;
  local_40.fSchemaInfo = pSVar3;
  GeneralAttributeCheck::checkAttributes
            (this_01,annotationElem,1,this,topLevel,(ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
  node = &XUtil::getFirstChildElement(&annotationElem->super_DOMNode)->super_DOMNode;
  if (node == (DOMNode *)0x0) {
    iVar8 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[7])(annotationElem);
    plVar12 = (long *)CONCAT44(extraout_var_02,iVar8);
    if ((plVar12 == (long *)0x0) || (iVar8 = (**(code **)(*plVar12 + 0x20))(plVar12), iVar8 != 3)) {
      local_60 = (XMLCh *)0x0;
    }
    else {
      local_60 = (XMLCh *)(**(code **)(*plVar12 + 0x140))(plVar12);
    }
  }
  else {
    local_60 = (XMLCh *)0x0;
    for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
      iVar8 = (*node->_vptr_DOMNode[0x18])(node);
      psVar11 = (short *)CONCAT44(extraout_var,iVar8);
      if (psVar11 == &SchemaSymbols::fgELT_APPINFO) {
LAB_00327a63:
        iVar8 = (*node->_vptr_DOMNode[7])(node);
        plVar12 = (long *)CONCAT44(extraout_var_00,iVar8);
        if ((plVar12 != (long *)0x0) &&
           (iVar8 = (**(code **)(*plVar12 + 0x20))(plVar12), iVar8 == 3)) {
          local_60 = (XMLCh *)(**(code **)(*plVar12 + 0x140))(plVar12);
        }
        GeneralAttributeCheck::checkAttributes
                  (this_01,(DOMElement *)node,4,this,false,
                   (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
      }
      else {
        psVar14 = &SchemaSymbols::fgELT_APPINFO;
        if (psVar11 == (short *)0x0) {
LAB_00327a2f:
          if (*psVar14 == 0) goto LAB_00327a63;
        }
        else {
          psVar14 = &SchemaSymbols::fgELT_APPINFO;
          psVar15 = psVar11;
          do {
            sVar1 = *psVar15;
            if (sVar1 == 0) goto LAB_00327a2f;
            psVar15 = psVar15 + 1;
            sVar2 = *psVar14;
            psVar14 = psVar14 + 1;
          } while (sVar1 == sVar2);
        }
        if (psVar11 == &SchemaSymbols::fgELT_DOCUMENTATION) {
LAB_00327ace:
          iVar8 = (*node->_vptr_DOMNode[7])(node);
          plVar12 = (long *)CONCAT44(extraout_var_01,iVar8);
          if ((plVar12 != (long *)0x0) &&
             (iVar8 = (**(code **)(*plVar12 + 0x20))(plVar12), iVar8 == 3)) {
            local_60 = (XMLCh *)(**(code **)(*plVar12 + 0x140))(plVar12);
          }
          GeneralAttributeCheck::checkAttributes
                    (this_01,(DOMElement *)node,0xe,this,false,
                     (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
        }
        else {
          psVar14 = &SchemaSymbols::fgELT_DOCUMENTATION;
          if (psVar11 == (short *)0x0) {
LAB_00327aaf:
            if (*psVar14 == 0) goto LAB_00327ace;
          }
          else {
            psVar14 = &SchemaSymbols::fgELT_DOCUMENTATION;
            do {
              sVar1 = *psVar11;
              if (sVar1 == 0) goto LAB_00327aaf;
              psVar11 = psVar11 + 1;
              sVar2 = *psVar14;
              psVar14 = psVar14 + 1;
            } while (sVar1 == sVar2);
          }
          reportSchemaError(this,(DOMElement *)node,L"http://apache.org/xml/messages/XMLErrors",0x90
                           );
        }
      }
    }
  }
  if ((local_60 == (XMLCh *)0x0) || (this->fScanner->fIgnoreAnnotations != false)) {
LAB_00327b80:
    this_02 = (XSAnnotation *)0x0;
  }
  else {
    XVar4 = nonXSAttList->fCurCount;
    if (XVar4 == 0) {
      this_02 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
      XSAnnotation::XSAnnotation(this_02,local_60,this->fGrammarPoolMemoryManager);
    }
    else {
      iVar8 = XMLString::patternMatch(local_60,L"annotation");
      if (iVar8 == -1) {
        this_02 = (XSAnnotation *)0x0;
      }
      else {
        this_00 = &this->fBuffer;
        (this->fBuffer).fIndex = 0;
        XMLBuffer::append(this_00,local_60,(long)(iVar8 + 10));
        getAt = 0;
        do {
          ppDVar13 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt(nonXSAttList,getAt);
          this_03 = (TraverseSchema *)*ppDVar13;
          iVar9 = (*(*(_func_int ***)this_03)[0x16])(this_03);
          iVar10 = (*(*(_func_int ***)this_03)[0x18])(this_03);
          iVar9 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[0x30])
                            (annotationElem,CONCAT44(extraout_var_03,iVar9),
                             CONCAT44(extraout_var_04,iVar10));
          psVar11 = (short *)CONCAT44(extraout_var_05,iVar9);
          if (psVar11 == &XMLUni::fgZeroLenString) {
LAB_00327c72:
            if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar5 = (this->fBuffer).fIndex;
            (this->fBuffer).fIndex = XVar5 + 1;
            (this->fBuffer).fBuffer[XVar5] = L' ';
            iVar9 = (*(*(_func_int ***)this_03)[2])(this_03);
            XMLBuffer::append(this_00,(XMLCh *)CONCAT44(extraout_var_06,iVar9));
            if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar6 = (this->fBuffer).fIndex;
            XVar5 = XVar6 + 1;
            (this->fBuffer).fIndex = XVar5;
            (this->fBuffer).fBuffer[XVar6] = L'=';
            if (XVar5 == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar5 = (this->fBuffer).fIndex;
            (this->fBuffer).fIndex = XVar5 + 1;
            (this->fBuffer).fBuffer[XVar5] = L'\"';
            iVar9 = (*(*(_func_int ***)this_03)[3])();
            processAttValue(this_03,(XMLCh *)CONCAT44(extraout_var_07,iVar9),this_00);
            if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
            }
            XVar5 = (this->fBuffer).fIndex;
            (this->fBuffer).fIndex = XVar5 + 1;
            (this->fBuffer).fBuffer[XVar5] = L'\"';
          }
          else {
            psVar14 = &XMLUni::fgZeroLenString;
            if (psVar11 == (short *)0x0) {
LAB_00327c68:
              if (*psVar14 == 0) goto LAB_00327c72;
            }
            else {
              psVar14 = &XMLUni::fgZeroLenString;
              do {
                sVar1 = *psVar11;
                if (sVar1 == 0) goto LAB_00327c68;
                psVar11 = psVar11 + 1;
                sVar2 = *psVar14;
                psVar14 = psVar14 + 1;
              } while (sVar1 == sVar2);
            }
          }
          getAt = getAt + 1;
        } while (getAt != XVar4);
        XMLBuffer::append(this_00,local_60 + (long)iVar8 + 10);
        this_02 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
        content = (this->fBuffer).fBuffer;
        content[(this->fBuffer).fIndex] = L'\0';
        XSAnnotation::XSAnnotation(this_02,content,this->fGrammarPoolMemoryManager);
      }
      if (iVar8 == -1) goto LAB_00327b80;
    }
    pp_Var7 = annotationElem[0x17].super_DOMNode._vptr_DOMNode;
    this_02->fLine = (XMLFileLoc)annotationElem[0x16].super_DOMNode._vptr_DOMNode;
    this_02->fCol = (XMLFileLoc)pp_Var7;
    XSAnnotation::setSystemId(this_02,this->fSchemaInfo->fCurrentSchemaURL);
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return this_02;
}

Assistant:

XSAnnotation*
TraverseSchema::traverseAnnotationDecl(const DOMElement* const annotationElem,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList,
                                       const bool topLevel) {

    NamespaceScopeManager nsMgr(annotationElem, fSchemaInfo, this);
    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        annotationElem, GeneralAttributeCheck::E_Annotation, this, topLevel
    );

    const XMLCh* contents = 0;
    DOMElement* child = XUtil::getFirstChildElement(annotationElem);
    if (child) {
        for (;
             child != 0;
             child = XUtil::getNextSiblingElement(child)) {

            const XMLCh* name = child->getLocalName();

            if (XMLString::equals(name, SchemaSymbols::fgELT_APPINFO)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Appinfo, this);
            }
            else if (XMLString::equals(name, SchemaSymbols::fgELT_DOCUMENTATION)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Documentation, this);
            }
            else {
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAnnotationContent);
            }
        }
    }
    else
    {
        // If the Annotation has no children, get the text directly
        DOMNode* textContent = annotationElem->getFirstChild();
        if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
            contents = ((DOMText*) textContent)->getData();
    }

    if (contents && !fScanner->getIgnoreAnnotations())
    {
        XSAnnotation* theAnnotation = 0;

        XMLSize_t nonXSAttSize = nonXSAttList->size();

        if (nonXSAttSize)
        {
            int annotTokenStart = XMLString::patternMatch(
                contents, SchemaSymbols::fgELT_ANNOTATION);

            if (annotTokenStart == -1) // something is wrong
                return 0;

            // set annotation element
            fBuffer.set(contents, annotTokenStart + 10);

            for (XMLSize_t i=0; i<nonXSAttSize; i++)
            {
                DOMNode* attNode = nonXSAttList->elementAt(i);

                if (!XMLString::equals(
                        annotationElem->getAttributeNS(
                           attNode->getNamespaceURI(), attNode->getLocalName())
                        , XMLUni::fgZeroLenString)
                   )
                {
                    continue;
                }

                fBuffer.append(chSpace);
                fBuffer.append(attNode->getNodeName());
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attNode->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
            }

            // add remaining annotation content
            fBuffer.append(contents + annotTokenStart + 10);

            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
        }
        else
        {
            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(contents, fGrammarPoolMemoryManager);
        }

        /***
         * set line, col and systemId info
        ***/
        theAnnotation->setLineCol(
                                  ((XSDElementNSImpl*)annotationElem)->getLineNo()
                                , ((XSDElementNSImpl*)annotationElem)->getColumnNo()
                                 );
        theAnnotation->setSystemId(fSchemaInfo->getCurrentSchemaURL());

        return theAnnotation;
    }

    return 0;
}